

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSocket.cpp
# Opt level: O2

void __thiscall brynet::net::DataSocket::postDisConnect(DataSocket *this)

{
  EventLoop *this_00;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  this_00 = (this->mEventLoop).
            super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 != (EventLoop *)0x0) {
    local_28._8_8_ = 0;
    local_10 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/DataSocket.cpp:745:35)>
               ::_M_invoke;
    local_18 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/DataSocket.cpp:745:35)>
               ::_M_manager;
    local_28._M_unused._M_object = this;
    EventLoop::pushAsyncProc(this_00,(USER_PROC *)&local_28);
    std::_Function_base::~_Function_base((_Function_base *)&local_28);
  }
  return;
}

Assistant:

void DataSocket::postDisConnect()
{
    if (mEventLoop != nullptr)
    {
        mEventLoop->pushAsyncProc([=](){
            procCloseInLoop();
        });
    }
}